

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retention_test.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::anon_unknown_0::RetentionTest_Field_Test::TestBody
          (RetentionTest_Field_Test *this)

{
  Descriptor *this_00;
  FieldDescriptor *pFVar1;
  ConstType options;
  
  this_00 = proto2_unittest::TopLevelMessage::GetDescriptor();
  pFVar1 = Descriptor::field(this_00,0);
  options = FieldOptions::
            GetExtension<google::protobuf::internal::MessageTypeTraits<proto2_unittest::OptionsMessage>,_(unsigned_char)__v_,_false,_0>
                      (pFVar1->options_,
                       (ExtensionIdentifier<google::protobuf::FieldOptions,_google::protobuf::internal::MessageTypeTraits<proto2_unittest::OptionsMessage>,_(unsigned_char)__v_,_false>
                        *)proto2_unittest::field_option);
  CheckOptionsMessageIsStrippedCorrectly(options);
  return;
}

Assistant:

TEST(RetentionTest, Field) {
  CheckOptionsMessageIsStrippedCorrectly(
      proto2_unittest::TopLevelMessage::descriptor()
          ->field(0)
          ->options()
          .GetExtension(proto2_unittest::field_option));
}